

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)

{
  int iVar1;
  int local_1c;
  int ret;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  local_1c = 0;
  iVar1 = xmlSchemaPreRun(vctxt);
  if (iVar1 < 0) {
    vctxt_local._4_4_ = -1;
  }
  else {
    if (vctxt->doc == (xmlDocPtr)0x0) {
      if (vctxt->reader == (xmlTextReaderPtr)0x0) {
        if ((vctxt->sax == (xmlSAXHandlerPtr)0x0) || (vctxt->parserCtxt == (xmlParserCtxtPtr)0x0)) {
          xmlSchemaInternalErr
                    ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaVStart","no instance to validate");
          local_1c = -1;
        }
        else {
          local_1c = xmlParseDocument(vctxt->parserCtxt);
        }
      }
    }
    else {
      local_1c = xmlSchemaVDocWalk(vctxt);
    }
    xmlSchemaPostRun(vctxt);
    if (local_1c == 0) {
      local_1c = vctxt->err;
    }
    vctxt_local._4_4_ = local_1c;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaVStart(xmlSchemaValidCtxtPtr vctxt)
{
    int ret = 0;

    if (xmlSchemaPreRun(vctxt) < 0)
        return(-1);

    if (vctxt->doc != NULL) {
	/*
	 * Tree validation.
	 */
	ret = xmlSchemaVDocWalk(vctxt);
#ifdef LIBXML_READER_ENABLED
    } else if (vctxt->reader != NULL) {
	/*
	 * XML Reader validation.
	 */
#ifdef XML_SCHEMA_READER_ENABLED
	ret = xmlSchemaVReaderWalk(vctxt);
#endif
#endif
    } else if ((vctxt->sax != NULL) && (vctxt->parserCtxt != NULL)) {
	/*
	 * SAX validation.
	 */
	ret = xmlParseDocument(vctxt->parserCtxt);
    } else {
	VERROR_INT("xmlSchemaVStart",
	    "no instance to validate");
	ret = -1;
    }

    xmlSchemaPostRun(vctxt);
    if (ret == 0)
	ret = vctxt->err;
    return (ret);
}